

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_true,_true>_>_>
::Base_matrix(Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_true,_true>_>_>
              *this,uint numberOfColumns,Column_settings *colSettings)

{
  ulong __n;
  allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_true,_true>_>_>_>_>
  local_2f;
  key_equal local_2e;
  hasher local_2d [13];
  Column_settings *local_20;
  Column_settings *colSettings_local;
  Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_true,_true>_>_>
  *pBStack_10;
  uint numberOfColumns_local;
  Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_true,_true>_>_>
  *this_local;
  
  local_20 = colSettings;
  colSettings_local._4_4_ = numberOfColumns;
  pBStack_10 = this;
  Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_true,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_true,_true>_>_>_>
  ::Base_swap(&this->
               super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options_with_row_access<(Column_types)7,_false,_false,_false,_true,_true,_true,_true>_>_>_>
              ,numberOfColumns);
  Matrix_row_access<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_true,_true>_>_>_>_>,_std::vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_true,_true>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_true,_true>_>_>_>_>_>_>,_false,_unsigned_int>
  ::Matrix_row_access(&this->super_Matrix_row_access_option,colSettings_local._4_4_);
  __n = (ulong)colSettings_local._4_4_;
  std::
  allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_true,_true>_>_>_>_>
  ::allocator(&local_2f);
  std::
  unordered_map<unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_true,_true>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_true,_true>_>_>_>_>_>
  ::unordered_map(&this->matrix_,__n,local_2d,&local_2e,&local_2f);
  std::
  allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_true,_true>_>_>_>_>
  ::~allocator(&local_2f);
  this->nextInsertIndex_ = 0;
  this->colSettings_ = local_20;
  return;
}

Assistant:

inline Base_matrix<Master_matrix>::Base_matrix(unsigned int numberOfColumns,
                                               Column_settings* colSettings)
    : Swap_opt(numberOfColumns),
      RA_opt(numberOfColumns),
      matrix_(!Master_matrix::Option_list::has_map_column_container && Master_matrix::Option_list::has_row_access
                  ? 0
                  : numberOfColumns),
      nextInsertIndex_(0),
      colSettings_(colSettings)
{
  if constexpr (!Master_matrix::Option_list::has_map_column_container && Master_matrix::Option_list::has_row_access)
    matrix_.reserve(numberOfColumns);
}